

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O0

void __thiscall QPDFWriter::initializeSpecialStreams(QPDFWriter *this)

{
  string *key;
  bool bVar1;
  element_type *peVar2;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *__x;
  mapped_type *pmVar3;
  reference __k;
  QPDFObjGen *c;
  iterator __end2;
  iterator __begin2;
  vector<QPDFObjGen,_std::allocator<QPDFObjGen>_> *__range2;
  QPDFObjectHandle local_d8;
  QPDFObjGen local_c8;
  int local_c0;
  int local_bc;
  int i;
  int n;
  vector<QPDFObjGen,_std::allocator<QPDFObjGen>_> contents_objects;
  string local_98 [32];
  undefined1 local_78 [8];
  QPDFObjectHandle contents;
  QPDFObjGen local_58;
  string *local_50;
  QPDFObjectHandle *page;
  iterator __end1;
  iterator __begin1;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *__range1;
  undefined1 local_28 [4];
  int num;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> pages;
  QPDFWriter *this_local;
  
  pages.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  peVar2 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  __x = QPDF::getAllPages(peVar2->pdf);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector
            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_28,__x);
  __range1._4_4_ = 0;
  __end1 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::begin
                     ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_28);
  page = (QPDFObjectHandle *)
         std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::end
                   ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_28);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                                     *)&page), bVar1) {
    local_50 = (string *)
               __gnu_cxx::
               __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
               ::operator*(&__end1);
    __range1._4_4_ = __range1._4_4_ + 1;
    peVar2 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    local_58 = QPDFObjectHandle::getObjGen((QPDFObjectHandle *)local_50);
    pmVar3 = std::
             map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
             ::operator[](&peVar2->page_object_to_seq,&local_58);
    key = local_50;
    *pmVar3 = __range1._4_4_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_98,"/Contents",
               (allocator<char> *)
               ((long)&contents_objects.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    QPDFObjectHandle::getKey((QPDFObjectHandle *)local_78,key);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&contents_objects.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>::vector
              ((vector<QPDFObjGen,_std::allocator<QPDFObjGen>_> *)&i);
    bVar1 = QPDFObjectHandle::isArray((QPDFObjectHandle *)local_78);
    if (bVar1) {
      local_bc = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)local_78);
      for (local_c0 = 0; local_c0 < local_bc; local_c0 = local_c0 + 1) {
        QPDFObjectHandle::getArrayItem(&local_d8,(int)local_78);
        local_c8 = QPDFObjectHandle::getObjGen(&local_d8);
        std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>::push_back
                  ((vector<QPDFObjGen,_std::allocator<QPDFObjGen>_> *)&i,&local_c8);
        QPDFObjectHandle::~QPDFObjectHandle(&local_d8);
      }
    }
    else {
      bVar1 = QPDFObjectHandle::isStream((QPDFObjectHandle *)local_78);
      if (bVar1) {
        __range2 = (vector<QPDFObjGen,_std::allocator<QPDFObjGen>_> *)
                   QPDFObjectHandle::getObjGen((QPDFObjectHandle *)local_78);
        std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>::push_back
                  ((vector<QPDFObjGen,_std::allocator<QPDFObjGen>_> *)&i,(value_type *)&__range2);
      }
    }
    __end2 = std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>::begin
                       ((vector<QPDFObjGen,_std::allocator<QPDFObjGen>_> *)&i);
    c = (QPDFObjGen *)
        std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>::end
                  ((vector<QPDFObjGen,_std::allocator<QPDFObjGen>_> *)&i);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<QPDFObjGen_*,_std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>_>
                                       *)&c), bVar1) {
      __k = __gnu_cxx::
            __normal_iterator<QPDFObjGen_*,_std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>_>::
            operator*(&__end2);
      peVar2 = std::
               __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      pmVar3 = std::
               map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
               ::operator[](&peVar2->contents_to_page_seq,__k);
      *pmVar3 = __range1._4_4_;
      peVar2 = std::
               __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>::insert
                (&peVar2->normalized_streams,__k);
      __gnu_cxx::
      __normal_iterator<QPDFObjGen_*,_std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>_>::
      operator++(&__end2);
    }
    std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>::~vector
              ((vector<QPDFObjGen,_std::allocator<QPDFObjGen>_> *)&i);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_78);
    __gnu_cxx::
    __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
    ::operator++(&__end1);
  }
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_28);
  return;
}

Assistant:

void
QPDFWriter::initializeSpecialStreams()
{
    // Mark all page content streams in case we are filtering or normalizing.
    std::vector<QPDFObjectHandle> pages = m->pdf.getAllPages();
    int num = 0;
    for (auto& page: pages) {
        m->page_object_to_seq[page.getObjGen()] = ++num;
        QPDFObjectHandle contents = page.getKey("/Contents");
        std::vector<QPDFObjGen> contents_objects;
        if (contents.isArray()) {
            int n = contents.getArrayNItems();
            for (int i = 0; i < n; ++i) {
                contents_objects.push_back(contents.getArrayItem(i).getObjGen());
            }
        } else if (contents.isStream()) {
            contents_objects.push_back(contents.getObjGen());
        }

        for (auto const& c: contents_objects) {
            m->contents_to_page_seq[c] = num;
            m->normalized_streams.insert(c);
        }
    }
}